

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointBeliefSparse.h
# Opt level: O0

JointBeliefSparse * __thiscall JointBeliefSparse::Clone(JointBeliefSparse *this)

{
  JointBeliefSparse *pJVar1;
  JointBeliefSparse *in_RDI;
  JointBeliefSparse *unaff_retaddr;
  
  pJVar1 = (JointBeliefSparse *)operator_new(0x58);
  JointBeliefSparse(unaff_retaddr,in_RDI);
  return pJVar1;
}

Assistant:

virtual JointBeliefSparse* Clone() const
        { return new JointBeliefSparse(*this); }